

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringCommand.cxx
# Opt level: O1

bool anon_unknown.dwarf_8e8839::HandleSubstringCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  pointer pbVar1;
  unsigned_long val;
  cmMakefile *this;
  int val_00;
  int val_01;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  string_view value;
  basic_string_view<char,_std::char_traits<char>_> local_e8;
  pointer ******local_d8;
  char *pcStack_d0;
  undefined8 local_c8;
  char *local_c0;
  pointer ******local_b8;
  char *pcStack_b0;
  string local_a8;
  undefined1 local_88 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78 [2];
  cmAlphaNum local_58;
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((long)(args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 == 0xa0) {
    val_00 = atoi(pbVar1[2]._M_dataplus._M_p);
    val_01 = atoi(pbVar1[3]._M_dataplus._M_p);
    val = pbVar1[1]._M_string_length;
    if (val_00 < 0 || (int)val < val_00) {
      cmAlphaNum::cmAlphaNum((cmAlphaNum *)local_88,val_00);
      local_e8._M_len = 0xd;
      local_e8._M_str = "begin index: ";
      local_d8 = (pointer ******)local_88._0_8_;
      pcStack_d0 = (char *)local_88._8_8_;
      local_c8 = 0x15;
      local_c0 = " is out of range 0 - ";
      cmAlphaNum::cmAlphaNum(&local_58,val);
      local_b8 = (pointer ******)local_58.View_._M_len;
      pcStack_b0 = local_58.View_._M_str;
      views._M_len = 4;
      views._M_array = &local_e8;
      cmCatViews_abi_cxx11_(&local_a8,views);
      std::__cxx11::string::_M_assign((string *)&status->Error);
      local_78[0]._M_allocated_capacity = local_a8.field_2._M_allocated_capacity;
      local_88._0_8_ = local_a8._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p == &local_a8.field_2) {
        return false;
      }
    }
    else {
      if (-2 < val_01) {
        this = status->Makefile;
        std::__cxx11::string::substr((ulong)&local_e8,(ulong)(pbVar1 + 1));
        value._M_str = (char *)local_e8._M_len;
        value._M_len = (size_t)local_e8._M_str;
        cmMakefile::AddDefinition(this,pbVar1 + 4,value);
        if ((pointer *******)local_e8._M_len != &local_d8) {
          operator_delete((void *)local_e8._M_len,(long)local_d8 + 1);
        }
        return true;
      }
      cmAlphaNum::cmAlphaNum(&local_58,val_01);
      local_e8._M_len = 0xb;
      local_e8._M_str = "end index: ";
      local_d8 = (pointer ******)local_58.View_._M_len;
      pcStack_d0 = local_58.View_._M_str;
      local_c8 = 0x18;
      local_c0 = " should be -1 or greater";
      views_00._M_len = 3;
      views_00._M_array = &local_e8;
      cmCatViews_abi_cxx11_((string *)local_88,views_00);
      std::__cxx11::string::_M_assign((string *)&status->Error);
      if ((undefined1 *)local_88._0_8_ == local_88 + 0x10) {
        return false;
      }
    }
  }
  else {
    local_e8._M_len = (size_t)&local_d8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_e8,"sub-command SUBSTRING requires four arguments.","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
    local_78[0]._0_8_ = local_d8;
    local_88._0_8_ = local_e8._M_len;
    if ((pointer *******)local_e8._M_len == &local_d8) {
      return false;
    }
  }
  operator_delete((void *)local_88._0_8_,local_78[0]._0_8_ + 1);
  return false;
}

Assistant:

bool HandleSubstringCommand(std::vector<std::string> const& args,
                            cmExecutionStatus& status)
{
  if (args.size() != 5) {
    status.SetError("sub-command SUBSTRING requires four arguments.");
    return false;
  }

  const std::string& stringValue = args[1];
  int begin = atoi(args[2].c_str());
  int end = atoi(args[3].c_str());
  const std::string& variableName = args[4];

  size_t stringLength = stringValue.size();
  int intStringLength = static_cast<int>(stringLength);
  if (begin < 0 || begin > intStringLength) {
    status.SetError(
      cmStrCat("begin index: ", begin, " is out of range 0 - ", stringLength));
    return false;
  }
  if (end < -1) {
    status.SetError(cmStrCat("end index: ", end, " should be -1 or greater"));
    return false;
  }

  status.GetMakefile().AddDefinition(variableName,
                                     stringValue.substr(begin, end));
  return true;
}